

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O0

bool __thiscall BigInt::operator<(BigInt *this,BigInt *b)

{
  __type_conflict _Var1;
  bool bVar2;
  BigInt local_60;
  BigInt local_40;
  BigInt *local_20;
  BigInt *b_local;
  BigInt *this_local;
  
  local_20 = b;
  b_local = this;
  to_string_abi_cxx11_(&local_40);
  to_string_abi_cxx11_(&local_60);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_40,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  if (_Var1) {
    this_local._7_1_ = false;
  }
  else {
    bVar2 = greater(this,local_20);
    this_local._7_1_ = (bool)((bVar2 ^ 0xffU) & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool BigInt::operator<(BigInt&& b) {
    if (this->to_string() == b.to_string()) {
        return false;
    }
    return !this->greater(b);
}